

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O2

void __thiscall deci::stack_t::stack_t(stack_t *this,stack_t *copy)

{
  value_t *pvVar1;
  
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::vector
            (&this->storage,&copy->storage);
  dictionary_t::dictionary_t(&this->context,&copy->context);
  pvVar1 = nothing_t::Instance();
  this->result = pvVar1;
  return;
}

Assistant:

stack_t::stack_t(const stack_t& copy)
    : storage(copy.storage)
    , context(copy.context)
    , result(&nothing_t::Instance())
  {
  }